

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_line_style.cxx
# Opt level: O1

void __thiscall
Fl_Graphics_Driver::line_style(Fl_Graphics_Driver *this,int style,int width,char *dashes)

{
  char cVar1;
  char cVar2;
  char cVar3;
  undefined8 uVar4;
  undefined6 uVar5;
  undefined8 in_RAX;
  size_t sVar6;
  char cVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  char buf [7];
  undefined8 uStack_38;
  
  iVar10 = -width;
  if (0 < width) {
    iVar10 = width;
  }
  fl_line_width_ = 1;
  if (width != 0) {
    fl_line_width_ = iVar10;
  }
  uStack_38 = in_RAX;
  if (dashes == (char *)0x0) {
    iVar10 = 0;
  }
  else {
    sVar6 = strlen(dashes);
    iVar10 = (int)sVar6;
  }
  uVar4 = uStack_38;
  if (iVar10 != 0) goto LAB_001efbcf;
  if ((char)style == '\0') {
    iVar10 = 0;
    goto LAB_001efbcf;
  }
  cVar3 = (char)width + (width == 0);
  bVar11 = ((uint)style >> 9 & 1) == 0;
  cVar7 = cVar3 * '\x02';
  if (bVar11) {
    cVar7 = cVar3 * '\x03';
  }
  cVar1 = cVar3 * '\x02' + -1;
  cVar2 = '\x01';
  if (bVar11) {
    cVar1 = cVar3;
    cVar2 = cVar3;
  }
  dashes = (char *)((long)&uStack_38 + 1);
  iVar9 = (int)&uStack_38 + 3;
  uVar5 = uStack_38._2_6_;
  iVar10 = (int)dashes;
  switch(style & 0xff) {
  case 1:
    pcVar8 = (char *)((long)&uStack_38 + 2);
    uStack_38._0_2_ = CONCAT11(cVar7,(undefined1)uStack_38);
    uStack_38 = CONCAT62(uVar5,(undefined2)uStack_38);
    iVar10 = iVar9;
    goto LAB_001efbca;
  case 2:
    pcVar8 = (char *)((long)&uStack_38 + 2);
    break;
  case 3:
    iVar9 = (int)&uStack_38 + 5;
    uStack_38._0_2_ = CONCAT11(cVar7,(undefined1)uStack_38);
    uStack_38._0_3_ = CONCAT12(cVar1,(undefined2)uStack_38);
    pcVar8 = (char *)((long)&uStack_38 + 4);
    break;
  case 4:
    iVar9 = (int)&uStack_38 + 7;
    uStack_38._0_2_ = CONCAT11(cVar7,(undefined1)uStack_38);
    uStack_38._0_3_ = CONCAT12(cVar1,(undefined2)uStack_38);
    uStack_38._5_3_ = SUB83(uVar4,5);
    uStack_38._0_5_ = CONCAT14(cVar1,CONCAT13(cVar2,(undefined3)uStack_38));
    pcVar8 = (char *)((long)&uStack_38 + 6);
    break;
  default:
    goto switchD_001efb7b_default;
  }
  pcVar8[-1] = cVar2;
  iVar10 = iVar9;
LAB_001efbca:
  *pcVar8 = cVar1;
switchD_001efb7b_default:
  iVar10 = iVar10 - (int)dashes;
LAB_001efbcf:
  XSetLineAttributes(fl_display,fl_gc,width,iVar10 != 0,
                     *(undefined4 *)((long)line_style::Cap + (ulong)((uint)style >> 6 & 0xc)),
                     *(undefined4 *)((long)line_style::Join + (ulong)((uint)style >> 10 & 0xc)));
  if (iVar10 != 0) {
    XSetDashes(fl_display,fl_gc,0,dashes,iVar10);
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::line_style(int style, int width, char* dashes) {

  // save line width in global variable for X11 clipping
  if (width == 0) fl_line_width_ = 1;
  else fl_line_width_ = width>0 ? width : -width;

#if defined(USE_X11)
  int ndashes = dashes ? strlen(dashes) : 0;
  // emulate the WIN32 dash patterns on X
  char buf[7];
  if (!ndashes && (style&0xff)) {
    int w = width ? width : 1;
    char dash, dot, gap;
    // adjust lengths to account for cap:
    if (style & 0x200) {
      dash = char(2*w);
      dot = 1; // unfortunately 0 does not work
      gap = char(2*w-1);
    } else {
      dash = char(3*w);
      dot = gap = char(w);
    }
    char* p = dashes = buf;
    switch (style & 0xff) {
    case FL_DASH:	*p++ = dash; *p++ = gap; break;
    case FL_DOT:	*p++ = dot; *p++ = gap; break;
    case FL_DASHDOT:	*p++ = dash; *p++ = gap; *p++ = dot; *p++ = gap; break;
    case FL_DASHDOTDOT: *p++ = dash; *p++ = gap; *p++ = dot; *p++ = gap; *p++ = dot; *p++ = gap; break;
    }
    ndashes = p-buf;
  }
  static int Cap[4] = {CapButt, CapButt, CapRound, CapProjecting};
  static int Join[4] = {JoinMiter, JoinMiter, JoinRound, JoinBevel};
  XSetLineAttributes(fl_display, fl_gc, width, 
		     ndashes ? LineOnOffDash : LineSolid,
		     Cap[(style>>8)&3], Join[(style>>12)&3]);
  if (ndashes) XSetDashes(fl_display, fl_gc, 0, dashes, ndashes);
#elif defined(WIN32)
  // According to Bill, the "default" cap and join should be the
  // "fastest" mode supported for the platform.  I don't know why
  // they should be different (same graphics cards, etc., right?) MRS
  static DWORD Cap[4]= {PS_ENDCAP_FLAT, PS_ENDCAP_FLAT, PS_ENDCAP_ROUND, PS_ENDCAP_SQUARE};
  static DWORD Join[4]={PS_JOIN_ROUND, PS_JOIN_MITER, PS_JOIN_ROUND, PS_JOIN_BEVEL};
  int s1 = PS_GEOMETRIC | Cap[(style>>8)&3] | Join[(style>>12)&3];
  DWORD a[16]; int n = 0;
  if (dashes && dashes[0]) {
    s1 |= PS_USERSTYLE;
    for (n = 0; n < 16 && *dashes; n++) a[n] = *dashes++;
  } else {
    s1 |= style & 0xff; // allow them to pass any low 8 bits for style
  }
  if ((style || n) && !width) width = 1; // fix cards that do nothing for 0?
  LOGBRUSH penbrush = {BS_SOLID,fl_RGB(),0}; // can this be fl_brush()?
  HPEN newpen = ExtCreatePen(s1, width, &penbrush, n, n ? a : 0);
  if (!newpen) {
    Fl::error("fl_line_style(): Could not create GDI pen object.");
    return;
  }
  HPEN oldpen = (HPEN)SelectObject(fl_gc, newpen);
  DeleteObject(oldpen);
  DeleteObject(fl_current_xmap->pen);
  fl_current_xmap->pen = newpen;
#elif defined(__APPLE_QUARTZ__)
  static /*enum*/ CGLineCap Cap[4] = { kCGLineCapButt, kCGLineCapButt,
                                   kCGLineCapRound, kCGLineCapSquare };
  static /*enum*/ CGLineJoin Join[4] = { kCGLineJoinMiter, kCGLineJoinMiter, 
                                    kCGLineJoinRound, kCGLineJoinBevel };
  if (width<1) width = 1;
  fl_quartz_line_width_ = (float)width; 
  fl_quartz_line_cap_ = Cap[(style>>8)&3];
  // when printing kCGLineCapSquare seems better for solid lines
  if ( Fl_Surface_Device::surface() != Fl_Display_Device::display_device() && style == FL_SOLID && dashes == NULL ) {
    fl_quartz_line_cap_ = kCGLineCapSquare;
    }
  fl_quartz_line_join_ = Join[(style>>12)&3];
  char *d = dashes; 
  static CGFloat pattern[16];
  if (d && *d) {
	CGFloat *p = pattern;
    while (*d) { *p++ = (float)*d++; }
    fl_quartz_line_pattern = pattern;
    fl_quartz_line_pattern_size = d-dashes;
  } else if (style & 0xff) {
    char dash, dot, gap;
    // adjust lengths to account for cap:
    if (style & 0x200) {
      dash = char(2*width);
      dot = 1; 
      gap = char(2*width-1);
    } else {
      dash = char(3*width);
      dot = gap = char(width);
    }
	CGFloat *p = pattern;
    switch (style & 0xff) {
    case FL_DASH:       *p++ = dash; *p++ = gap; break;
    case FL_DOT:        *p++ = dot; *p++ = gap; break;
    case FL_DASHDOT:    *p++ = dash; *p++ = gap; *p++ = dot; *p++ = gap; break;
    case FL_DASHDOTDOT: *p++ = dash; *p++ = gap; *p++ = dot; *p++ = gap; *p++ = dot; *p++ = gap; break;
    }
    fl_quartz_line_pattern_size = p-pattern;
    fl_quartz_line_pattern = pattern;
  } else {
    fl_quartz_line_pattern = 0; 
		fl_quartz_line_pattern_size = 0;
  }
  fl_quartz_restore_line_style_();
#else
# error unsupported platform
#endif
}